

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elasticConstantsCmd.cpp
# Opt level: O0

int cmdline_parser2(int argc,char **argv,gengetopt_args_info *args_info,int override,int initialize,
                   int check_required)

{
  int iVar1;
  cmdline_parser_params params;
  int result;
  char *in_stack_00000100;
  cmdline_parser_params *in_stack_00000108;
  gengetopt_args_info *in_stack_00000110;
  char **in_stack_00000118;
  int in_stack_00000120;
  
  iVar1 = cmdline_parser_internal
                    (in_stack_00000120,in_stack_00000118,in_stack_00000110,in_stack_00000108,
                     in_stack_00000100);
  if (iVar1 == 1) {
    cmdline_parser_free((gengetopt_args_info *)0x14458a);
    exit(1);
  }
  return iVar1;
}

Assistant:

int
cmdline_parser2 (int argc, char **argv, struct gengetopt_args_info *args_info, int override, int initialize, int check_required)
{
  int result;
  struct cmdline_parser_params params;
  
  params.override = override;
  params.initialize = initialize;
  params.check_required = check_required;
  params.check_ambiguity = 0;
  params.print_errors = 1;

  result = cmdline_parser_internal (argc, argv, args_info, &params, 0);

  if (result == EXIT_FAILURE)
    {
      cmdline_parser_free (args_info);
      exit (EXIT_FAILURE);
    }
  
  return result;
}